

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_edit.cc
# Opt level: O1

void rcg::anon_unknown_0::redraw
               (vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                *list,int *top_row,int focus_row,char *message)

{
  int row;
  int iVar1;
  pointer pNVar2;
  int row_00;
  char *str;
  int iVar3;
  long lVar4;
  gcstring local_80 [80];
  
  if (_stdscr == 0) {
    iVar3 = -1;
  }
  else {
    iVar3 = *(short *)(_stdscr + 4) + 1;
  }
  erase();
  if (1 < iVar3) {
    row = iVar3 + -1;
    if (focus_row < *top_row) {
      *top_row = focus_row;
    }
    if (*top_row + row <= focus_row) {
      *top_row = (focus_row - iVar3) + 2;
    }
    iVar3 = 1;
    if (1 < row) {
      iVar3 = row;
    }
    lVar4 = 0;
    do {
      iVar1 = *top_row;
      row_00 = (int)lVar4;
      pNVar2 = (list->
               super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar1 + row_00 <
          (int)((ulong)((long)(list->
                              super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) >> 4)) {
        redraw_line(row_00,pNVar2 + iVar1 + lVar4,focus_row - iVar1 == row_00,
                    SUB41(focus_row - iVar1,0));
      }
      lVar4 = lVar4 + 1;
    } while (iVar3 != (int)lVar4);
    if ((message != (char *)0x0) && (*message != '\0')) {
      mvaddstr_eol(row,0,message,true);
      return;
    }
    (**(code **)(*(long *)(list->
                          super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                          )._M_impl.super__Vector_impl_data._M_start[focus_row].node + 0x58))
              (local_80);
    str = (char *)GenICam_3_4::gcstring::c_str();
    mvaddstr_eol(row,0,str,true);
    GenICam_3_4::gcstring::~gcstring(local_80);
  }
  return;
}

Assistant:

void redraw(std::vector<NodeParam> &list, int &top_row, int focus_row, const char *message=0)
{
  int rows=getmaxy(stdscr);

  erase();

  if (rows > 1)
  {
    rows--; // last row is used for showing tool tips and errors

    // focus row must always be visible

    if (focus_row < top_row) top_row=focus_row;
    if (focus_row > top_row+rows-1) top_row=focus_row-rows+1;

    // print all visible rows

    for (int i=0; i<rows; i++)
    {
      if (top_row+i < static_cast<int>(list.size()))
      {
        redraw_line(i, list[top_row+i], focus_row == top_row+i);
      }
    }

    if (message && *message != '\0')
    {
      mvaddstr_eol(rows, 0, message, true);
    }
    else
    {
      list[focus_row].printTooltip(rows, true);
    }
  }
}